

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void multi_client_performance(size_t n)

{
  pointer psVar1;
  shared_ptr<std::thread> *p;
  pointer psVar2;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> *__range1;
  bool bVar3;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> group;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> local_58;
  shared_ptr<std::thread> local_38;
  
  local_58.
  super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while (psVar1 = local_58.
                  super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, bVar3 = n != 0, n = n - 1,
        psVar2 = local_58.
                 super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, bVar3) {
    std::make_shared<std::thread,void(&)()>((_func_void *)&local_38);
    std::vector<std::shared_ptr<std::thread>,std::allocator<std::shared_ptr<std::thread>>>::
    emplace_back<std::shared_ptr<std::thread>>
              ((vector<std::shared_ptr<std::thread>,std::allocator<std::shared_ptr<std::thread>>> *)
               &local_58,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  for (; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    std::thread::join();
  }
  std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::~vector
            (&local_58);
  return;
}

Assistant:

void multi_client_performance(size_t n) {
  std::vector<std::shared_ptr<std::thread>> group;
  for (int i = 0; i < n; ++i) {
    group.emplace_back(std::make_shared<std::thread>(
        test_performance1)); // []{test_performance1();});
  }
  for (auto &p : group) {
    p->join();
  }
}